

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O3

BoolExpr * BO_and(List *ls)

{
  bool bVar1;
  BoolExpr *pBVar2;
  BoolExpr *pBVar3;
  ListStruct *ls_00;
  BoolExpr *pBVar4;
  
  pBVar2 = (BoolExpr *)malloc(0x18);
  pBVar2->type = E_AND;
  pBVar2->subexpr = (BoolExprStruct *)0x0;
  pBVar2->next = (BoolExprStruct *)0x0;
  ls_00 = ls->cdr;
  if (ls_00 != (ListStruct *)0x0) {
    pBVar4 = (BoolExpr *)0x0;
    bVar1 = false;
    do {
      pBVar3 = make_boolean_expr(ls_00);
      if (pBVar3->type == E_TRUE) {
        bVar1 = true;
      }
      else {
        if (pBVar3->type == E_FALSE) goto LAB_00108bbe;
        pBVar3->next = pBVar4;
        pBVar2->subexpr = pBVar3;
        pBVar4 = pBVar3;
      }
      ls_00 = ls_00->cdr;
    } while (ls_00 != (ListStruct *)0x0);
    if (pBVar4 != (BoolExpr *)0x0) {
      if (pBVar4->next != (BoolExprStruct *)0x0) {
        return pBVar2;
      }
      return pBVar4;
    }
    if (bVar1) {
      return &true_bool_expr;
    }
  }
  parse_error((List *)0x0,"and takes arguments!\n");
LAB_00108bbe:
  return &false_bool_expr;
}

Assistant:

static BoolExpr *
BO_and(const List *ls)
{
  BoolExpr *subexpr, *ret;
  BOOL hit_true = FALSE;

  ret = create_bool_expr (E_AND, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_FALSE)  /* If we ever hit FALSE, expr is FALSE */
	return &false_bool_expr;
      if (subexpr->type != E_TRUE)   /* No sense adding in TRUE statements */
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	}
      else hit_true = TRUE;
    }
  if (ret->subexpr == NULL)
    {
      if (hit_true)   /* If we hit nothing but TRUE's return TRUE */
	return &true_bool_expr;
      parse_error(ls, "and takes arguments!\n");
      return &false_bool_expr;  /* default = FALSE */
    }
  
  if (ret->subexpr->next == NULL) /* (and a) == a */
    return ret->subexpr;   
  
  return ret;
}